

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O1

void rxa2_fill_first_blocks(uint8_t *blockhash,argon2_instance_t *instance)

{
  uint32_t uVar1;
  block *pbVar2;
  long lVar3;
  uint uVar4;
  uint8_t blockhash_bytes [1024];
  uint64_t local_428 [129];
  
  if (instance->lanes != 0) {
    uVar4 = 0;
    do {
      blockhash[0x40] = '\0';
      blockhash[0x41] = '\0';
      blockhash[0x42] = '\0';
      blockhash[0x43] = '\0';
      *(uint *)(blockhash + 0x44) = uVar4;
      randomx_blake2b_long(local_428,0x400,blockhash,0x48);
      uVar1 = instance->lane_length;
      pbVar2 = instance->memory;
      lVar3 = 0;
      do {
        pbVar2[uVar1 * uVar4].v[lVar3] = local_428[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x80);
      blockhash[0x40] = '\x01';
      blockhash[0x41] = '\0';
      blockhash[0x42] = '\0';
      blockhash[0x43] = '\0';
      randomx_blake2b_long(local_428,0x400,blockhash,0x48);
      uVar1 = instance->lane_length;
      pbVar2 = instance->memory;
      lVar3 = 0;
      do {
        pbVar2[uVar1 * uVar4 + 1].v[lVar3] = local_428[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x80);
      uVar4 = uVar4 + 1;
    } while (uVar4 < instance->lanes);
  }
  return;
}

Assistant:

void rxa2_fill_first_blocks(uint8_t *blockhash, const argon2_instance_t *instance) {
	uint32_t l;
	/* Make the first and second block in each lane as G(H0||0||i) or
	   G(H0||1||i) */
	uint8_t blockhash_bytes[ARGON2_BLOCK_SIZE];
	for (l = 0; l < instance->lanes; ++l) {

		store32(blockhash + ARGON2_PREHASH_DIGEST_LENGTH, 0);
		store32(blockhash + ARGON2_PREHASH_DIGEST_LENGTH + 4, l);
		blake2b_long(blockhash_bytes, ARGON2_BLOCK_SIZE, blockhash,
			ARGON2_PREHASH_SEED_LENGTH);
		load_block(&instance->memory[l * instance->lane_length + 0],
			blockhash_bytes);

		store32(blockhash + ARGON2_PREHASH_DIGEST_LENGTH, 1);
		blake2b_long(blockhash_bytes, ARGON2_BLOCK_SIZE, blockhash,
			ARGON2_PREHASH_SEED_LENGTH);
		load_block(&instance->memory[l * instance->lane_length + 1],
			blockhash_bytes);
	}
}